

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  int *piVar1;
  float fVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *window;
  ImGuiViewportP **ppIVar4;
  ImDrawData *pIVar5;
  _func_void_ImDrawData_ptr *p_Var6;
  undefined1 auVar7 [16];
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImGuiWindow *pIVar10;
  bool bVar11;
  undefined4 extraout_EAX;
  uint uVar12;
  ImDrawList *pIVar13;
  ImDrawList **ppIVar14;
  ulong uVar15;
  int n_2;
  long lVar16;
  ulong uVar17;
  int n_3;
  ImGuiWindow *pIVar18;
  int n;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ImRect IVar22;
  ImVec2 local_98;
  float local_88;
  float fStack_84;
  float local_78;
  ImGuiWindow *windows_to_render_top_most [2];
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 uv [4];
  
  pIVar9 = GImGui;
  iVar20 = GImGui->FrameCountEnded;
  if (iVar20 != GImGui->FrameCount) {
    EndFrame();
    iVar20 = pIVar9->FrameCount;
  }
  pIVar9->FrameCountRendered = iVar20;
  (pIVar9->IO).MetricsRenderWindows = 0;
  (pIVar9->IO).MetricsRenderVertices = 0;
  (pIVar9->IO).MetricsRenderIndices = 0;
  for (uVar19 = 0; uVar19 != (uint)(pIVar9->Viewports).Size; uVar19 = uVar19 + 1) {
    pIVar3 = (pIVar9->Viewports).Data[uVar19];
    ImDrawDataBuilder::Clear(&pIVar3->DrawDataBuilder);
    if (pIVar3->DrawLists[0] != (ImDrawList *)0x0) {
      pIVar13 = GetBackgroundDrawList(&pIVar3->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar13);
    }
  }
  pIVar18 = pIVar9->NavWindowingTarget;
  if (pIVar18 == (ImGuiWindow *)0x0) {
    windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar18->Flags & 0x2000) == 0) {
      windows_to_render_top_most[0] = pIVar18->RootWindow;
    }
    else {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    }
    pIVar18 = pIVar9->NavWindowingList;
  }
  pIVar10 = windows_to_render_top_most[0];
  windows_to_render_top_most[1] = pIVar18;
  for (uVar19 = 0; uVar19 != (uint)(pIVar9->Windows).Size; uVar19 = uVar19 + 1) {
    window = (pIVar9->Windows).Data[uVar19];
    if (((window->Active == true) && (window->Hidden == false)) &&
       ((window != pIVar18 && window != pIVar10) && (window->Flags & 0x1000000) == 0)) {
      AddRootWindowToDrawData(window);
    }
  }
  for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
    pIVar18 = windows_to_render_top_most[lVar16];
    if (((pIVar18 != (ImGuiWindow *)0x0) && (pIVar18->Active == true)) && (pIVar18->Hidden == false)
       ) {
      AddRootWindowToDrawData(pIVar18);
    }
  }
  local_88 = 0.0;
  fStack_84 = 0.0;
  local_78 = 0.0;
  if ((pIVar9->IO).MouseDrawCursor == false) {
    local_98.x = 0.0;
    local_98.y = 0.0;
  }
  else {
    local_98.x = 0.0;
    local_98.y = 0.0;
    if (pIVar9->MouseCursor != -1) {
      local_50.x = 0.0;
      local_50.y = 0.0;
      local_58.x = 0.0;
      local_58.y = 0.0;
      uv[2].x = 0.0;
      uv[2].y = 0.0;
      uv[3].x = 0.0;
      uv[3].y = 0.0;
      local_88 = 0.0;
      fStack_84 = 0.0;
      uv[0].x = 0.0;
      uv[0].y = 0.0;
      uv[1].x = 0.0;
      uv[1].y = 0.0;
      bVar11 = ImFontAtlas::GetMouseCursorTexData
                         ((pIVar9->IO).Fonts,pIVar9->MouseCursor,&local_50,&local_58,uv,uv + 2);
      local_78 = 0.0;
      local_98.x = 0.0;
      local_98.y = 0.0;
      if (bVar11) {
        fVar2 = (pIVar9->Style).MouseCursorScale;
        local_98 = (pIVar9->IO).MousePos;
        local_78 = local_98.y;
        local_88 = fVar2 * (local_58.x + 2.0) + local_98.x;
        fStack_84 = fVar2 * (local_58.y + 2.0) + local_78;
      }
    }
  }
  (pIVar9->IO).MetricsRenderVertices = 0;
  (pIVar9->IO).MetricsRenderIndices = 0;
  for (lVar16 = 0; ppIVar4 = (pIVar9->Viewports).Data, lVar16 < (pIVar9->Viewports).Size;
      lVar16 = lVar16 + 1) {
    pIVar3 = ppIVar4[lVar16];
    ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar3->DrawDataBuilder);
    IVar22 = ImGuiViewportP::GetRect(pIVar3);
    if ((((local_78 < IVar22.Max.y) &&
         (iVar20 = -(uint)(IVar22.Min.x < local_88), iVar21 = -(uint)(IVar22.Min.y < fStack_84),
         auVar7._4_4_ = iVar20, auVar7._0_4_ = iVar20, auVar7._8_4_ = iVar21, auVar7._12_4_ = iVar21
         , uVar12 = movmskpd(extraout_EAX,auVar7), (byte)((byte)uVar12 >> 1) != 0)) &&
        (local_98.x < IVar22.Max.x)) && ((uVar12 & 1) != 0)) {
      pIVar13 = GetForegroundDrawList(&pIVar3->super_ImGuiViewport);
      RenderMouseCursor(pIVar13,(pIVar9->IO).MousePos,(pIVar9->Style).MouseCursorScale,
                        pIVar9->MouseCursor,0xffffffff,0xff000000,0x30000000);
    }
    if (pIVar3->DrawLists[1] != (ImDrawList *)0x0) {
      pIVar13 = GetForegroundDrawList(&pIVar3->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar13);
    }
    (pIVar3->super_ImGuiViewport).DrawData = &pIVar3->DrawDataP;
    (pIVar3->DrawDataP).Valid = true;
    uVar12 = (pIVar3->DrawDataBuilder).Layers[0].Size;
    if ((int)uVar12 < 1) {
      ppIVar14 = (ImDrawList **)0x0;
    }
    else {
      ppIVar14 = (pIVar3->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar3->DrawDataP).CmdLists = ppIVar14;
    (pIVar3->DrawDataP).CmdListsCount = uVar12;
    (pIVar3->DrawDataP).TotalIdxCount = 0;
    (pIVar3->DrawDataP).TotalVtxCount = 0;
    IVar8 = (pIVar3->super_ImGuiViewport).Size;
    (pIVar3->DrawDataP).DisplayPos = (pIVar3->super_ImGuiViewport).Pos;
    (pIVar3->DrawDataP).DisplaySize = IVar8;
    (pIVar3->DrawDataP).FramebufferScale = (GImGui->IO).DisplayFramebufferScale;
    (pIVar3->DrawDataP).OwnerViewport = &pIVar3->super_ImGuiViewport;
    uVar15 = 0;
    uVar19 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar19 = uVar15;
    }
    iVar20 = 0;
    for (uVar17 = 0; uVar19 != uVar17; uVar17 = uVar17 + 1) {
      pIVar13 = (pIVar3->DrawDataBuilder).Layers[0].Data[uVar17];
      iVar20 = iVar20 + (pIVar13->VtxBuffer).Size;
      (pIVar3->DrawDataP).TotalVtxCount = iVar20;
      uVar12 = (int)uVar15 + (pIVar13->IdxBuffer).Size;
      uVar15 = (ulong)uVar12;
      (pIVar3->DrawDataP).TotalIdxCount = uVar12;
    }
    piVar1 = &(pIVar9->IO).MetricsRenderVertices;
    *piVar1 = *piVar1 + iVar20;
    piVar1 = &(pIVar9->IO).MetricsRenderIndices;
    *piVar1 = *piVar1 + (int)uVar15;
  }
  pIVar5 = ((*ppIVar4)->super_ImGuiViewport).DrawData;
  if ((0 < pIVar5->CmdListsCount) &&
     (p_Var6 = (pIVar9->IO).RenderDrawListsFn, p_Var6 != (_func_void_ImDrawData_ptr *)0x0)) {
    (*p_Var6)(pIVar5);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render (for each active window)
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingList : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the tp-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested
    ImRect mouse_cursor_rect;
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
    {
        ImVec2 offset, size, uv[4];
        if (g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &offset, &size, &uv[0], &uv[2]))
            mouse_cursor_rect = ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(size.x + 2, size.y + 2) * g.Style.MouseCursorScale);
    }

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        if (viewport->GetRect().Overlaps(mouse_cursor_rect))
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        g.IO.MetricsRenderVertices += viewport->DrawData->TotalVtxCount;
        g.IO.MetricsRenderIndices += viewport->DrawData->TotalIdxCount;
    }

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.Viewports[0]->DrawData->CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(g.Viewports[0]->DrawData);
#endif
}